

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::destroy
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  domain_type *this_00;
  
  while (this->m_current != this->m_start) {
    this_00 = this->m_current + -1;
    this->m_current = this_00;
    domain_type::~domain_type(this_00);
  }
  operator_delete(this->m_data,this->m_size * 0x60);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}